

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O2

void __thiscall Face::print_triangle(Face *this,Corner ref_corner,int layer,int entry)

{
  Color CVar1;
  
  CVar1 = get_triangle_color(this,ref_corner,layer,entry);
  if (CVar1 < 4) {
    printf(&DAT_00109234 + *(int *)(&DAT_00109234 + (ulong)CVar1 * 4));
    return;
  }
  return;
}

Assistant:

void Face::print_triangle(Corner ref_corner, int layer, int entry){
    Color triangle_color = get_triangle_color(ref_corner, layer, entry);
    switch (triangle_color)
    {
    case Color::blue:
        printf("\033[1;34mB\033[0m");
        break;
    case Color::red:
        printf("\033[1;31mR\033[0m");
        break;             
    case Color::yellow:
        printf("\033[1;33mY\033[0m");
        break;
    case Color::green:
        printf("\033[1;32mG\033[0m");
        break;
    default:
        break;
    }
}